

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

status_t __thiscall libchars::commands::run(commands *this,filter_t mask_)

{
  history *phVar1;
  bool bVar2;
  char *pcVar3;
  string local_50;
  
  build_commands(this);
  if ((this->super_edit_object).prompt._M_string_length == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_edit_object).prompt,0,(char *)0x0,0x115393);
  }
  this->mask = mask_;
  if (((this->edit).driver)->is_tty == false) {
    parse(this);
LAB_0010e5f7:
    return this->status;
  }
  reset_status(this);
LAB_0010e3fb:
  editor::edit(&this->edit,&this->super_edit_object,this->timeout);
  switch((this->edit).k) {
  case KEY_UP:
    phVar1 = this->remember;
    if (phVar1 == (history *)0x0) goto LAB_0010e3fb;
    if (phVar1[8] == (history)0x0) {
      value_abi_cxx11_(&local_50,this);
      history::set(phVar1,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    bVar2 = history::prev(this->remember);
    break;
  case KEY_DOWN:
    phVar1 = this->remember;
    if ((phVar1 == (history *)0x0) || (phVar1[8] != (history)0x1)) goto LAB_0010e3fb;
    bVar2 = history::next(phVar1);
    break;
  case KEY_PGUP:
    phVar1 = this->remember;
    if (phVar1 != (history *)0x0) {
      if ((phVar1[8] == (history)0x1) &&
         (*(size_t *)(phVar1 + 0x58) != (this->super_edit_object).insert_idx)) {
        history::cancel(phVar1);
      }
      phVar1 = this->remember;
      if (phVar1[8] == (history)0x0) {
        value_abi_cxx11_(&local_50,this);
        history::set(phVar1,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar2 = history::search(this->remember,(this->super_edit_object).insert_idx);
      }
      else {
        bVar2 = history::search_prev(phVar1);
      }
      goto LAB_0010e5bf;
    }
    goto LAB_0010e3fb;
  case KEY_PGDN:
    phVar1 = this->remember;
    if (phVar1 != (history *)0x0) {
      if ((phVar1[8] == (history)0x1) &&
         (*(size_t *)(phVar1 + 0x58) != (this->super_edit_object).insert_idx)) {
        history::cancel(phVar1);
      }
      if (this->remember[8] == (history)0x1) {
        bVar2 = history::search_next(this->remember);
LAB_0010e5bf:
        if (bVar2 != false) {
          pcVar3 = history::current(this->remember);
          (*(this->super_edit_object)._vptr_edit_object[3])
                    (this,pcVar3,*(undefined8 *)(this->remember + 0x58));
        }
      }
    }
    goto LAB_0010e3fb;
  default:
    terminal_driver::newline((this->edit).driver);
    (this->super_edit_object).cursor = 0;
    (this->super_edit_object).prompt_rendered = 0;
    return EMPTY;
  case KEY_TAB:
    auto_complete(this);
    goto LAB_0010e3fb;
  case KEY_ENTER:
    dump_tokens(this);
    terminal_driver::newline((this->edit).driver);
    (this->super_edit_object).cursor = 0;
    (this->super_edit_object).prompt_rendered = 0;
    phVar1 = this->remember;
    if (phVar1 != (history *)0x0) {
      if (((this->status == EMPTY) || (this->status == TERMINATED)) ||
         ((this->super_edit_object).buflen == 0)) {
        history::cancel(phVar1);
      }
      else {
        value_abi_cxx11_(&local_50,this);
        history::add(phVar1,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
    goto LAB_0010e5f7;
  case KEY_HELP:
    goto switchD_0010e427_caseD_10;
  case KEY_QUIT:
    terminal_driver::newline((this->edit).driver);
    (this->super_edit_object).cursor = 0;
    (this->super_edit_object).prompt_rendered = 0;
    return TERMINATED;
  case SEQ_TIMEOUT:
    return TIMEOUT;
  case FORCED_RET:
    return FORCED_RETURN;
  }
  if (bVar2 != false) {
    pcVar3 = history::current(this->remember);
    (*(this->super_edit_object)._vptr_edit_object[3])(this,pcVar3,0xffffffffffffffff);
  }
  goto LAB_0010e3fb;
switchD_0010e427_caseD_10:
  if ((this->super_edit_object).buflen <= (this->super_edit_object).insert_idx) {
    show_help(this);
  }
  goto LAB_0010e3fb;
}

Assistant:

commands::status_t commands::run(command::filter_t mask_)
    {
        build_commands();

        if (this->prompt.empty())
          this->prompt = ">";
        this->mask = mask_;

        if (!edit.interactive()) {
          parse();
          return status;
        }
        else {
          // reset command structures before starting new command string
          reset_status();

          while (true) {
              (void)edit.edit(*this,timeout);
              switch (edit.key()) {
              case SEQ_TIMEOUT:
                  return TIMEOUT;
              case FORCED_RET:
                  return FORCED_RETURN;
              case KEY_ENTER:
                  //TODO: remove quotes from strings
                  dump_tokens();
                  edit.newline();
                  rewind();
                  // record current line in history
                  if (remember != NULL) {
                      if (status != TERMINATED && status != EMPTY && remember != NULL && length() > 0)
                          remember->add(value());
                      else
                          remember->cancel();
                  }
                  return status;
              case KEY_TAB:
                  auto_complete();
                  break;
              case KEY_HELP:
                  if (insert_idx >= length())
                      show_help();
                  break;
              case KEY_QUIT:
                  edit.newline();
                  rewind();
                  return TERMINATED;
              case KEY_UP:
                  if (remember != NULL) {
                      if (!remember->searching())
                          remember->set(value());
                      if (remember->prev())
                          set(remember->current());
                  }
                  break;
              case KEY_DOWN:
                  if (remember != NULL && remember->searching() && remember->next())
                      set(remember->current());
                  break;
              case KEY_PGUP:
                  if (remember != NULL) {
                      if (remember->searching() && remember->search_idx() != insert_idx)
                          remember->cancel();

                      if (!remember->searching()) {
                          remember->set(value());
                          if (remember->search(insert_idx)) {
                              set(remember->current(),remember->search_idx());
                          }
                      }
                      else {
                          if (remember->search_prev()) {
                              set(remember->current(),remember->search_idx());
                          }
                      }
                  }
                  break;
              case KEY_PGDN:
                  if (remember != NULL) {
                      if (remember->searching() && remember->search_idx() != insert_idx)
                          remember->cancel();

                      if (remember->searching() && remember->search_next())
                          set(remember->current(),remember->search_idx());
                  }
                  break;
              default:
                  edit.newline();
                  rewind();
                  return EMPTY;
              }
          }
        }

        return EMPTY;
    }